

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperloglog.cpp
# Opt level: O3

int duckdb_hll::hllMerge(uint8_t *max,robj *hll)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  byte *pbVar4;
  byte bVar5;
  int iVar6;
  byte bVar7;
  long lVar8;
  
  pvVar1 = hll->ptr;
  if (*(char *)((long)pvVar1 + 4) == '\0') {
    uVar2 = 0;
    do {
      uVar3 = uVar2 >> 3 & 0x1fffffff;
      bVar5 = (byte)(CONCAT11(*(undefined1 *)((long)pvVar1 + uVar3 + 0x12),
                              *(undefined1 *)((long)pvVar1 + uVar3 + 0x11)) >> ((byte)uVar2 & 7)) &
              0x3f;
      if (*max < bVar5) {
        *max = bVar5;
      }
      uVar2 = uVar2 + 6;
      max = max + 1;
    } while (uVar2 != 0x6000);
  }
  else {
    switch(*(byte *)((long)pvVar1 + -1) & 7) {
    case 0:
      uVar2 = (ulong)(*(byte *)((long)pvVar1 + -1) >> 3);
      break;
    case 1:
      uVar2 = (ulong)*(byte *)((long)pvVar1 + -4);
      break;
    case 2:
      uVar2 = (ulong)*(ushort *)((long)pvVar1 + -6);
      break;
    case 3:
      uVar2 = (ulong)*(uint *)((long)pvVar1 + -10);
      break;
    case 4:
      uVar2 = *(ulong *)((long)pvVar1 + -0x12);
      break;
    default:
      return -1;
    }
    if ((long)uVar2 < 0x12) {
      return -1;
    }
    pbVar4 = (byte *)((long)pvVar1 + 0x11);
    iVar6 = 0;
    do {
      bVar5 = *pbVar4;
      if ((bVar5 & 0xffffffc0) == 0x40) {
        iVar6 = iVar6 + (bVar5 & 0x3f) * 0x100 + (uint)pbVar4[1] + 1;
        lVar8 = 2;
      }
      else {
        if ((bVar5 & 0xc0) == 0) {
          iVar6 = iVar6 + (uint)bVar5 + 1;
        }
        else {
          bVar7 = bVar5 >> 2 & 0x1f;
          lVar8 = 0;
          do {
            if (max[lVar8 + iVar6] <= bVar7) {
              max[lVar8 + iVar6] = bVar7 + 1;
            }
            lVar8 = lVar8 + 1;
          } while ((ulong)(bVar5 & 3) + 1 != lVar8);
          iVar6 = iVar6 + (int)lVar8;
        }
        lVar8 = 1;
      }
      pbVar4 = pbVar4 + lVar8;
    } while (pbVar4 < (byte *)(uVar2 + (long)pvVar1));
    if (iVar6 != 0x1000) {
      return -1;
    }
  }
  return 0;
}

Assistant:

int hllMerge(uint8_t *max, robj *hll) {
    struct hllhdr *hdr = (struct hllhdr *) hll->ptr;
    int i;

    if (hdr->encoding == HLL_DENSE) {
        uint8_t val;

        for (i = 0; i < HLL_REGISTERS; i++) {
            HLL_DENSE_GET_REGISTER(val,hdr->registers + 1,i);
            if (val > max[i]) max[i] = val;
        }
    } else {
        uint8_t *p = (uint8_t *) hll->ptr, *end = p + sdslen((sds) hll->ptr);
        long runlen, regval;

        p += HLL_HDR_SIZE;
        i = 0;
        while(p < end) {
            if (HLL_SPARSE_IS_ZERO(p)) {
                runlen = HLL_SPARSE_ZERO_LEN(p);
                i += runlen;
                p++;
            } else if (HLL_SPARSE_IS_XZERO(p)) {
                runlen = HLL_SPARSE_XZERO_LEN(p);
                i += runlen;
                p += 2;
            } else {
                runlen = HLL_SPARSE_VAL_LEN(p);
                regval = HLL_SPARSE_VAL_VALUE(p);
                while(runlen--) {
                    if (regval > max[i]) max[i] = regval;
                    i++;
                }
                p++;
            }
        }
        if (i != HLL_REGISTERS) return HLL_C_ERR;
    }
    return HLL_C_OK;
}